

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_struct.h
# Opt level: O0

void psa_set_key_lifetime(psa_key_attributes_t *attributes,psa_key_lifetime_t lifetime)

{
  psa_key_lifetime_t lifetime_local;
  psa_key_attributes_t *attributes_local;
  
  (attributes->core).lifetime = lifetime;
  if (lifetime == 0) {
    (attributes->core).id = 0;
  }
  return;
}

Assistant:

static inline void psa_set_key_lifetime(psa_key_attributes_t *attributes,
                                        psa_key_lifetime_t lifetime)
{
    attributes->core.lifetime = lifetime;
    if( lifetime == PSA_KEY_LIFETIME_VOLATILE )
    {
#ifdef MBEDTLS_PSA_CRYPTO_KEY_FILE_ID_ENCODES_OWNER
        attributes->core.id.key_id = 0;
        attributes->core.id.owner = 0;
#else
        attributes->core.id = 0;
#endif
    }
}